

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O0

void __thiscall MP1Node::nodeLoopOps(MP1Node *this)

{
  long lVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  ostream *poVar5;
  size_type sVar6;
  pointer pMVar7;
  Address local_96;
  reference pvStack_90;
  Address toAddr;
  MemberListEntry *entry;
  int randomIndex;
  __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
  local_78;
  __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
  local_70;
  iterator entry_1;
  short port;
  string local_38 [36];
  int local_14;
  MP1Node *pMStack_10;
  int id;
  MP1Node *this_local;
  
  pMStack_10 = this;
  poVar5 = std::operator<<((ostream *)&std::cout,"start nodeLoopOps...");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  iVar4 = Params::getcurrtime(this->par);
  if ((3 < iVar4) &&
     (sVar6 = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::size
                        (&this->memberNode->memberList), 1 < sVar6)) {
    Address::getAddress_abi_cxx11_((Address *)local_38);
    iVar4 = getIdFromAddress(this,local_38);
    std::__cxx11::string::~string((string *)local_38);
    local_14 = iVar4;
    Address::getAddress_abi_cxx11_((Address *)&entry_1);
    sVar3 = getPortFromAddress(this,(string *)&entry_1);
    std::__cxx11::string::~string((string *)&entry_1);
    local_70._M_current =
         (MemberListEntry *)
         std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::begin
                   (&this->memberNode->memberList);
    while( true ) {
      local_78._M_current =
           (MemberListEntry *)
           std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::end
                     (&this->memberNode->memberList);
      bVar2 = __gnu_cxx::operator!=(&local_70,&local_78);
      if (!bVar2) break;
      pMVar7 = __gnu_cxx::
               __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
               ::operator->(&local_70);
      if ((pMVar7->id == local_14) &&
         (pMVar7 = __gnu_cxx::
                   __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
                   ::operator->(&local_70), pMVar7->port == sVar3)) {
        pMVar7 = __gnu_cxx::
                 __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
                 ::operator->(&local_70);
        iVar4 = Params::getcurrtime(this->par);
        MemberListEntry::settimestamp(pMVar7,(long)iVar4);
        pMVar7 = __gnu_cxx::
                 __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
                 ::operator->(&local_70);
        lVar1 = pMVar7->heartbeat;
        pMVar7 = __gnu_cxx::
                 __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
                 ::operator->(&local_70);
        pMVar7->heartbeat = lVar1 + 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
      ::operator++(&local_70,0);
    }
    iVar4 = rand();
    sVar6 = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::size
                      (&this->memberNode->memberList);
    pvStack_90 = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::operator[]
                           (&this->memberNode->memberList,
                            (long)((int)((ulong)(long)iVar4 % (sVar6 - 1)) + 1));
    iVar4 = Params::getcurrtime(this->par);
    if (5 < (long)iVar4 - pvStack_90->timestamp) {
      return;
    }
    Address::Address(&local_96);
    local_96.addr._0_4_ = pvStack_90->id;
    local_96.addr._4_2_ = pvStack_90->port;
    sendMembershipList(this,&local_96,HEARTBEATREQ);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"...end nodeLoopOps.");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void MP1Node::nodeLoopOps() {
    cout << "start nodeLoopOps..." << endl;

    //completess and accuracy tests fail when this executed of par->getcurrtime() <= 3
    if (par->getcurrtime() > 3 && memberNode->memberList.size() > 1) {

        //update own node's heartbeat and timestamp
        int id = getIdFromAddress(memberNode->addr.getAddress());
        short port = getPortFromAddress(memberNode->addr.getAddress());
        for (vector<MemberListEntry>::iterator entry = memberNode->memberList.begin();
             entry != memberNode->memberList.end(); entry++) {
            if (entry->id == id && entry->port == port) {
                entry->settimestamp(par->getcurrtime());
                entry->heartbeat = entry->heartbeat + 1;
                break;
            }
        }

        //GOSSIP PROTOCOL: pick a random member to send the member list to
        int randomIndex = rand() % (memberNode->memberList.size() - 1) + 1;
        MemberListEntry &entry = memberNode->memberList[randomIndex];

        //check if that node has failed before sending member list to it
        if (par->getcurrtime() - entry.timestamp > TFAIL) {
            return;
        }

        //send member list
        Address toAddr;
        memcpy(&toAddr.addr[0], &entry.id, sizeof(int));
        memcpy(&toAddr.addr[4], &entry.port, sizeof(short));
        this->sendMembershipList(&toAddr, HEARTBEATREQ);
    }

    cout << "...end nodeLoopOps." << endl;
    return;
}